

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O0

int Io_ReadBlifNetworkOutputLoad(Io_ReadBlif_t *p,Vec_Ptr_t *vTokens)

{
  undefined8 uVar1;
  Vec_Int_t *pVVar2;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  int iVar3;
  Abc_Obj_t *pAVar4;
  double dVar5;
  double dVar6;
  double TimeFall;
  double TimeRise;
  char *pFoo2;
  char *pFoo1;
  Abc_Obj_t *pNet;
  Vec_Ptr_t *vTokens_local;
  Io_ReadBlif_t *p_local;
  
  pNet = (Abc_Obj_t *)vTokens;
  vTokens_local = (Vec_Ptr_t *)p;
  iVar3 = strncmp((char *)*vTokens->pArray,".output_load",0xc);
  if (iVar3 == 0) {
    if (*(int *)((long)&pNet->pNtk + 4) == 4) {
      pFoo1 = (char *)Abc_NtkFindNet((Abc_Ntk_t *)vTokens_local[1].pArray,(char *)pNet->pNext->pNext
                                    );
      if ((Abc_Obj_t *)pFoo1 == (Abc_Obj_t *)0x0) {
        iVar3 = Extra_FileReaderGetLineNumber((Extra_FileReader_t *)vTokens_local->pArray,0);
        vTokens_local[2].nCap = iVar3;
        sprintf((char *)&vTokens_local[9].pArray,
                "Cannot find object corresponding to %s on .output_load line.",pNet->pNext->pNext);
        Io_ReadBlifPrintErrorMessage((Io_ReadBlif_t *)vTokens_local);
        p_local._4_4_ = 1;
      }
      else {
        dVar5 = strtod(*(char **)&pNet->pNext->Id,&pFoo2);
        dVar6 = strtod(*(char **)&pNet->pNext->vFanins,(char **)&TimeRise);
        if ((*pFoo2 == '\0') && (*(char *)TimeRise == '\0')) {
          pVVar2 = (Vec_Int_t *)vTokens_local[5].pArray;
          pNtk = (Abc_Ntk_t *)vTokens_local[1].pArray;
          pNtk_00 = (Abc_Ntk_t *)vTokens_local[1].pArray;
          pAVar4 = Abc_ObjFanout0((Abc_Obj_t *)pFoo1);
          pAVar4 = Abc_NtkObj(pNtk_00,pAVar4->Id);
          iVar3 = Io_ReadFindCoId(pNtk,pAVar4);
          Vec_IntPush(pVVar2,iVar3);
          pVVar2 = (Vec_Int_t *)vTokens_local[5].pArray;
          iVar3 = Abc_Float2Int((float)dVar5);
          Vec_IntPush(pVVar2,iVar3);
          pVVar2 = (Vec_Int_t *)vTokens_local[5].pArray;
          iVar3 = Abc_Float2Int((float)dVar6);
          Vec_IntPush(pVVar2,iVar3);
          p_local._4_4_ = 0;
        }
        else {
          iVar3 = Extra_FileReaderGetLineNumber((Extra_FileReader_t *)vTokens_local->pArray,0);
          vTokens_local[2].nCap = iVar3;
          uVar1._0_4_ = (pNet->pNext->vFanins).nCap;
          uVar1._4_4_ = (pNet->pNext->vFanins).nSize;
          sprintf((char *)&vTokens_local[9].pArray,
                  "Bad value (%s %s) for rise or fall time on .output_load line.",
                  *(undefined8 *)&pNet->pNext->Id,uVar1);
          Io_ReadBlifPrintErrorMessage((Io_ReadBlif_t *)vTokens_local);
          p_local._4_4_ = 1;
        }
      }
    }
    else {
      iVar3 = Extra_FileReaderGetLineNumber((Extra_FileReader_t *)vTokens_local->pArray,0);
      vTokens_local[2].nCap = iVar3;
      sprintf((char *)&vTokens_local[9].pArray,"Wrong number of arguments on .output_load line.");
      Io_ReadBlifPrintErrorMessage((Io_ReadBlif_t *)vTokens_local);
      p_local._4_4_ = 1;
    }
    return p_local._4_4_;
  }
  __assert_fail("strncmp( (char *)vTokens->pArray[0], \".output_load\", 12 ) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                ,0x456,"int Io_ReadBlifNetworkOutputLoad(Io_ReadBlif_t *, Vec_Ptr_t *)");
}

Assistant:

int Io_ReadBlifNetworkOutputLoad( Io_ReadBlif_t * p, Vec_Ptr_t * vTokens )
{
    Abc_Obj_t * pNet;
    char * pFoo1, * pFoo2;
    double TimeRise, TimeFall;
 
    // make sure this is indeed the .inputs line
    assert( strncmp( (char *)vTokens->pArray[0], ".output_load", 12 ) == 0 );
    if ( vTokens->nSize != 4 )
    {
        p->LineCur = Extra_FileReaderGetLineNumber(p->pReader, 0);
        sprintf( p->sError, "Wrong number of arguments on .output_load line." );
        Io_ReadBlifPrintErrorMessage( p );
        return 1;
    }
    pNet = Abc_NtkFindNet( p->pNtkCur, (char *)vTokens->pArray[1] );
    if ( pNet == NULL )
    {
        p->LineCur = Extra_FileReaderGetLineNumber(p->pReader, 0);
        sprintf( p->sError, "Cannot find object corresponding to %s on .output_load line.", (char*)vTokens->pArray[1] );
        Io_ReadBlifPrintErrorMessage( p );
        return 1;
    }
    TimeRise = strtod( (char *)vTokens->pArray[2], &pFoo1 );
    TimeFall = strtod( (char *)vTokens->pArray[3], &pFoo2 );
    if ( *pFoo1 != '\0' || *pFoo2 != '\0' )
    {
        p->LineCur = Extra_FileReaderGetLineNumber(p->pReader, 0);
        sprintf( p->sError, "Bad value (%s %s) for rise or fall time on .output_load line.", (char*)vTokens->pArray[2], (char*)vTokens->pArray[3] );
        Io_ReadBlifPrintErrorMessage( p );
        return 1;
    }
    // set timing info
//    Abc_NtkTimeSetOutputLoad( p->pNtkCur, Io_ReadFindCoId(p->pNtkCur, Abc_NtkObj(p->pNtkCur, Abc_ObjFanout0(pNet)->Id)), (float)TimeRise, (float)TimeFall );
    Vec_IntPush( p->vOutLoads, Io_ReadFindCoId(p->pNtkCur, Abc_NtkObj(p->pNtkCur, Abc_ObjFanout0(pNet)->Id)) );
    Vec_IntPush( p->vOutLoads, Abc_Float2Int((float)TimeRise) );
    Vec_IntPush( p->vOutLoads, Abc_Float2Int((float)TimeFall) );
    return 0;
}